

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidget::show(QWidget *this)

{
  int iVar1;
  
  if (((this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) {
    iVar1 = (**(code **)(*QGuiApplicationPrivate::platform_integration + 0xa8))();
    if (iVar1 == 2) {
      showMaximized(this);
      return;
    }
    if (iVar1 == 4) {
      showFullScreen(this);
      return;
    }
  }
  (**(code **)(*(long *)this + 0x68))(this,1);
  return;
}

Assistant:

void QWidget::show()
{
    // Note: We don't call showNormal() as not to clobber Qt::Window(Max/Min)imized

    if (!isWindow()) {
        setVisible(true);
    } else {
        const auto *platformIntegration = QGuiApplicationPrivate::platformIntegration();
        Qt::WindowState defaultState = platformIntegration->defaultWindowState(data->window_flags);
        if (defaultState == Qt::WindowFullScreen)
            showFullScreen();
        else if (defaultState == Qt::WindowMaximized)
            showMaximized();
        else
            setVisible(true);
    }
}